

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O3

void highbd_copy_and_extend_plane
               (uint8_t *src8,int src_pitch,uint8_t *dst8,int dst_pitch,int w,int h,int extend_top,
               int extend_left,int extend_bottom,int extend_right)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t __n;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  undefined2 *puVar16;
  void *pvVar17;
  undefined2 *__src;
  uint16_t *dest16;
  void *pvVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar33;
  undefined1 auVar24 [16];
  int iVar34;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar53;
  int iVar57;
  undefined1 in_XMM4 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  
  lVar10 = (long)dst8 * 2;
  lVar11 = (long)extend_left;
  pvVar17 = (void *)(lVar10 + lVar11 * -2);
  lVar12 = (long)dst_pitch;
  if (0 < h) {
    lVar19 = lVar10 + (long)w * 2;
    __n = (long)w * 2;
    puVar16 = (undefined2 *)(__n + (long)src8 * 2 + -2);
    __src = (undefined2 *)((long)src8 * 2);
    lVar13 = lVar11 + -1;
    auVar62._8_4_ = (int)lVar13;
    auVar62._0_8_ = lVar13;
    auVar62._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = (long)extend_right + -1;
    auVar60._8_4_ = (int)lVar13;
    auVar60._0_8_ = lVar13;
    auVar60._12_4_ = (int)((ulong)lVar13 >> 0x20);
    iVar15 = 0;
    auVar60 = auVar60 ^ _DAT_004c83c0;
    pvVar18 = pvVar17;
    auVar63 = _DAT_004c9f60;
    auVar64 = _DAT_004c9f70;
    auVar65 = _DAT_004c83a0;
    auVar66 = _DAT_004c83b0;
    auVar67 = _DAT_004c83c0;
    do {
      if (extend_left != 0) {
        uVar1 = *__src;
        uVar14 = 0;
        auVar59 = auVar60;
        do {
          auVar20._8_4_ = (int)uVar14;
          auVar20._0_8_ = uVar14;
          auVar20._12_4_ = (int)(uVar14 >> 0x20);
          auVar24 = auVar62 ^ auVar67;
          auVar35 = (auVar20 | auVar66) ^ auVar67;
          iVar47 = auVar24._0_4_;
          iVar53 = -(uint)(iVar47 < auVar35._0_4_);
          iVar52 = auVar24._4_4_;
          auVar36._4_4_ = -(uint)(iVar52 < auVar35._4_4_);
          iVar33 = auVar24._8_4_;
          iVar57 = -(uint)(iVar33 < auVar35._8_4_);
          iVar34 = auVar24._12_4_;
          auVar36._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
          auVar44._4_4_ = iVar53;
          auVar44._0_4_ = iVar53;
          auVar44._8_4_ = iVar57;
          auVar44._12_4_ = iVar57;
          auVar58 = pshuflw(in_XMM5,auVar44,0xe8);
          auVar24._4_4_ = -(uint)(auVar35._4_4_ == iVar52);
          auVar24._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar61 = pshuflw(auVar59,auVar24,0xe8);
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar35 = pshuflw(auVar58,auVar36,0xe8);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar59 = (auVar35 | auVar61 & auVar58) ^ auVar59;
          auVar59 = packssdw(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2) = uVar1;
          }
          auVar36 = auVar24 & auVar44 | auVar36;
          auVar59 = packssdw(auVar36,auVar36);
          auVar35._8_4_ = 0xffffffff;
          auVar35._0_8_ = 0xffffffffffffffff;
          auVar35._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar35,auVar59 ^ auVar35);
          if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2 + 2) = uVar1;
          }
          auVar59 = (auVar20 | auVar65) ^ auVar67;
          iVar53 = -(uint)(iVar47 < auVar59._0_4_);
          auVar54._4_4_ = -(uint)(iVar52 < auVar59._4_4_);
          iVar57 = -(uint)(iVar33 < auVar59._8_4_);
          auVar54._12_4_ = -(uint)(iVar34 < auVar59._12_4_);
          auVar37._4_4_ = iVar53;
          auVar37._0_4_ = iVar53;
          auVar37._8_4_ = iVar57;
          auVar37._12_4_ = iVar57;
          auVar48._4_4_ = -(uint)(auVar59._4_4_ == iVar52);
          auVar48._12_4_ = -(uint)(auVar59._12_4_ == iVar34);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar59 = auVar48 & auVar37 | auVar54;
          auVar59 = packssdw(auVar59,auVar59);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar2,auVar59 ^ auVar2);
          if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2 + 4) = uVar1;
          }
          auVar24 = pshufhw(auVar37,auVar37,0x84);
          auVar36 = pshufhw(auVar48,auVar48,0x84);
          auVar35 = pshufhw(auVar24,auVar54,0x84);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar38 = (auVar35 | auVar36 & auVar24) ^ auVar38;
          auVar24 = packssdw(auVar38,auVar38);
          if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2 + 6) = uVar1;
          }
          auVar24 = (auVar20 | auVar64) ^ auVar67;
          iVar53 = -(uint)(iVar47 < auVar24._0_4_);
          auVar40._4_4_ = -(uint)(iVar52 < auVar24._4_4_);
          iVar57 = -(uint)(iVar33 < auVar24._8_4_);
          auVar40._12_4_ = -(uint)(iVar34 < auVar24._12_4_);
          auVar49._4_4_ = iVar53;
          auVar49._0_4_ = iVar53;
          auVar49._8_4_ = iVar57;
          auVar49._12_4_ = iVar57;
          auVar35 = pshuflw(auVar59,auVar49,0xe8);
          auVar39._4_4_ = -(uint)(auVar24._4_4_ == iVar52);
          auVar39._12_4_ = -(uint)(auVar24._12_4_ == iVar34);
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          auVar59 = pshuflw(auVar61 & auVar58,auVar39,0xe8);
          auVar59 = auVar59 & auVar35;
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar24 = pshuflw(auVar35,auVar40,0xe8);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar58 = (auVar24 | auVar59) ^ auVar58;
          in_XMM5 = packssdw(auVar58,auVar58);
          if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2 + 8) = uVar1;
          }
          auVar40 = auVar39 & auVar49 | auVar40;
          auVar24 = packssdw(auVar40,auVar40);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24 ^ auVar61,auVar24 ^ auVar61);
          if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2 + 10) = uVar1;
          }
          auVar20 = (auVar20 | auVar63) ^ auVar67;
          auVar50._0_4_ = -(uint)(iVar47 < auVar20._0_4_);
          auVar50._4_4_ = -(uint)(iVar52 < auVar20._4_4_);
          auVar50._8_4_ = -(uint)(iVar33 < auVar20._8_4_);
          auVar50._12_4_ = -(uint)(iVar34 < auVar20._12_4_);
          auVar41._4_4_ = auVar50._0_4_;
          auVar41._0_4_ = auVar50._0_4_;
          auVar41._8_4_ = auVar50._8_4_;
          auVar41._12_4_ = auVar50._8_4_;
          auVar21._4_4_ = -(uint)(auVar20._4_4_ == iVar52);
          auVar21._12_4_ = -(uint)(auVar20._12_4_ == iVar34);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar25._4_4_ = auVar50._4_4_;
          auVar25._0_4_ = auVar50._4_4_;
          auVar25._8_4_ = auVar50._12_4_;
          auVar25._12_4_ = auVar50._12_4_;
          in_XMM4 = auVar21 & auVar41 | auVar25;
          auVar20 = packssdw(auVar50,in_XMM4);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 ^ auVar3,auVar20 ^ auVar3);
          if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2 + 0xc) = uVar1;
          }
          auVar35 = pshufhw(auVar41,auVar41,0x84);
          auVar20 = pshufhw(auVar21,auVar21,0x84);
          auVar24 = pshufhw(auVar25,auVar25,0x84);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar20 = packssdw(auVar20 & auVar35,(auVar24 | auVar20 & auVar35) ^ auVar4);
          if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)pvVar18 + uVar14 * 2 + 0xe) = uVar1;
          }
          uVar14 = uVar14 + 8;
        } while ((lVar11 + 7U & 0xfffffffffffffff8) != uVar14);
      }
      memcpy((void *)(lVar11 * 2 + (long)pvVar18),__src,__n);
      auVar64 = _DAT_004c9f70;
      auVar63 = _DAT_004c9f60;
      auVar67 = _DAT_004c83c0;
      auVar66 = _DAT_004c83b0;
      auVar65 = _DAT_004c83a0;
      if (extend_right != 0) {
        uVar1 = *puVar16;
        uVar14 = 0;
        do {
          auVar22._8_4_ = (int)uVar14;
          auVar22._0_8_ = uVar14;
          auVar22._12_4_ = (int)(uVar14 >> 0x20);
          auVar59 = (auVar22 | auVar66) ^ auVar67;
          iVar33 = auVar60._0_4_;
          iVar47 = -(uint)(iVar33 < auVar59._0_4_);
          iVar34 = auVar60._4_4_;
          auVar27._4_4_ = -(uint)(iVar34 < auVar59._4_4_);
          iVar53 = auVar60._8_4_;
          iVar52 = -(uint)(iVar53 < auVar59._8_4_);
          iVar57 = auVar60._12_4_;
          auVar27._12_4_ = -(uint)(iVar57 < auVar59._12_4_);
          auVar42._4_4_ = iVar47;
          auVar42._0_4_ = iVar47;
          auVar42._8_4_ = iVar52;
          auVar42._12_4_ = iVar52;
          auVar20 = pshuflw(in_XMM4,auVar42,0xe8);
          auVar26._4_4_ = -(uint)(auVar59._4_4_ == iVar34);
          auVar26._12_4_ = -(uint)(auVar59._12_4_ == iVar57);
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          auVar24 = pshuflw(in_XMM5,auVar26,0xe8);
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar59 = pshuflw(auVar20,auVar27,0xe8);
          auVar55._8_4_ = 0xffffffff;
          auVar55._0_8_ = 0xffffffffffffffff;
          auVar55._12_4_ = 0xffffffff;
          auVar55 = (auVar59 | auVar24 & auVar20) ^ auVar55;
          auVar59 = packssdw(auVar55,auVar55);
          if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(lVar19 + uVar14 * 2) = uVar1;
          }
          auVar27 = auVar26 & auVar42 | auVar27;
          auVar59 = packssdw(auVar27,auVar27);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar5,auVar59 ^ auVar5);
          if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)(lVar19 + 2 + uVar14 * 2) = uVar1;
          }
          auVar59 = (auVar22 | auVar65) ^ auVar67;
          iVar47 = -(uint)(iVar33 < auVar59._0_4_);
          auVar51._4_4_ = -(uint)(iVar34 < auVar59._4_4_);
          iVar52 = -(uint)(iVar53 < auVar59._8_4_);
          auVar51._12_4_ = -(uint)(iVar57 < auVar59._12_4_);
          auVar28._4_4_ = iVar47;
          auVar28._0_4_ = iVar47;
          auVar28._8_4_ = iVar52;
          auVar28._12_4_ = iVar52;
          auVar43._4_4_ = -(uint)(auVar59._4_4_ == iVar34);
          auVar43._12_4_ = -(uint)(auVar59._12_4_ == iVar57);
          auVar43._0_4_ = auVar43._4_4_;
          auVar43._8_4_ = auVar43._12_4_;
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar59 = auVar43 & auVar28 | auVar51;
          auVar59 = packssdw(auVar59,auVar59);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar6,auVar59 ^ auVar6);
          if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(lVar19 + 4 + uVar14 * 2) = uVar1;
          }
          auVar35 = pshufhw(auVar28,auVar28,0x84);
          auVar44 = pshufhw(auVar43,auVar43,0x84);
          auVar36 = pshufhw(auVar35,auVar51,0x84);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = (auVar36 | auVar44 & auVar35) ^ auVar29;
          auVar35 = packssdw(auVar29,auVar29);
          if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(lVar19 + 6 + uVar14 * 2) = uVar1;
          }
          auVar35 = (auVar22 | auVar64) ^ auVar67;
          iVar47 = -(uint)(iVar33 < auVar35._0_4_);
          auVar31._4_4_ = -(uint)(iVar34 < auVar35._4_4_);
          iVar52 = -(uint)(iVar53 < auVar35._8_4_);
          auVar31._12_4_ = -(uint)(iVar57 < auVar35._12_4_);
          auVar45._4_4_ = iVar47;
          auVar45._0_4_ = iVar47;
          auVar45._8_4_ = iVar52;
          auVar45._12_4_ = iVar52;
          auVar59 = pshuflw(auVar59,auVar45,0xe8);
          auVar30._4_4_ = -(uint)(auVar35._4_4_ == iVar34);
          auVar30._12_4_ = -(uint)(auVar35._12_4_ == iVar57);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar20 = pshuflw(auVar24 & auVar20,auVar30,0xe8);
          in_XMM5 = auVar20 & auVar59;
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar59 = pshuflw(auVar59,auVar31,0xe8);
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar56 = (auVar59 | in_XMM5) ^ auVar56;
          in_XMM4 = packssdw(auVar56,auVar56);
          if ((in_XMM4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(lVar19 + 8 + uVar14 * 2) = uVar1;
          }
          auVar31 = auVar30 & auVar45 | auVar31;
          auVar59 = packssdw(auVar31,auVar31);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar7,auVar59 ^ auVar7);
          if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)(lVar19 + 10 + uVar14 * 2) = uVar1;
          }
          auVar59 = (auVar22 | auVar63) ^ auVar67;
          iVar47 = -(uint)(iVar33 < auVar59._0_4_);
          auVar46._4_4_ = -(uint)(iVar34 < auVar59._4_4_);
          iVar52 = -(uint)(iVar53 < auVar59._8_4_);
          auVar46._12_4_ = -(uint)(iVar57 < auVar59._12_4_);
          auVar32._4_4_ = iVar47;
          auVar32._0_4_ = iVar47;
          auVar32._8_4_ = iVar52;
          auVar32._12_4_ = iVar52;
          auVar23._4_4_ = -(uint)(auVar59._4_4_ == iVar34);
          auVar23._12_4_ = -(uint)(auVar59._12_4_ == iVar57);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar59 = auVar23 & auVar32 | auVar46;
          auVar59 = packssdw(auVar59,auVar59);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar8,auVar59 ^ auVar8);
          if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(lVar19 + 0xc + uVar14 * 2) = uVar1;
          }
          auVar20 = pshufhw(auVar32,auVar32,0x84);
          auVar59 = pshufhw(auVar23,auVar23,0x84);
          auVar24 = pshufhw(auVar20,auVar46,0x84);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 & auVar20,(auVar24 | auVar59 & auVar20) ^ auVar9);
          if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(lVar19 + 0xe + uVar14 * 2) = uVar1;
          }
          uVar14 = uVar14 + 8;
        } while (((long)extend_right + 7U & 0xfffffffffffffff8) != uVar14);
      }
      __src = __src + src_pitch;
      puVar16 = puVar16 + src_pitch;
      pvVar18 = (void *)((long)pvVar18 + lVar12 * 2);
      iVar15 = iVar15 + 1;
      lVar19 = lVar19 + lVar12 * 2;
    } while (iVar15 != h);
  }
  lVar19 = (long)(extend_left + w + extend_right);
  if (0 < extend_top) {
    pvVar18 = (void *)(lVar10 + (long)-(dst_pitch * extend_top) * 2 + lVar11 * -2);
    do {
      memcpy(pvVar18,pvVar17,lVar19 * 2);
      pvVar18 = (void *)((long)pvVar18 + lVar12 * 2);
      extend_top = extend_top + -1;
    } while (extend_top != 0);
  }
  if (0 < extend_bottom) {
    pvVar17 = (void *)(lVar10 + (long)(h * dst_pitch) * 2 + lVar11 * -2);
    do {
      memcpy(pvVar17,(void *)(lVar10 + (long)((h + -1) * dst_pitch) * 2 + lVar11 * -2),lVar19 * 2);
      pvVar17 = (void *)((long)pvVar17 + lVar12 * 2);
      extend_bottom = extend_bottom + -1;
    } while (extend_bottom != 0);
  }
  return;
}

Assistant:

static void highbd_copy_and_extend_plane(const uint8_t *src8, int src_pitch,
                                         uint8_t *dst8, int dst_pitch, int w,
                                         int h, int extend_top, int extend_left,
                                         int extend_bottom, int extend_right) {
  int i, linesize;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);

  // copy the left and right most columns out
  const uint16_t *src_ptr1 = src;
  const uint16_t *src_ptr2 = src + w - 1;
  uint16_t *dst_ptr1 = dst - extend_left;
  uint16_t *dst_ptr2 = dst + w;

  for (i = 0; i < h; i++) {
    aom_memset16(dst_ptr1, src_ptr1[0], extend_left);
    memcpy(dst_ptr1 + extend_left, src_ptr1, w * sizeof(src_ptr1[0]));
    aom_memset16(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_pitch;
    src_ptr2 += src_pitch;
    dst_ptr1 += dst_pitch;
    dst_ptr2 += dst_pitch;
  }

  // Now copy the top and bottom lines into each line of the respective
  // borders
  src_ptr1 = dst - extend_left;
  src_ptr2 = dst + dst_pitch * (h - 1) - extend_left;
  dst_ptr1 = dst + dst_pitch * (-extend_top) - extend_left;
  dst_ptr2 = dst + dst_pitch * (h)-extend_left;
  linesize = extend_left + extend_right + w;
  assert(linesize <= dst_pitch);

  for (i = 0; i < extend_top; i++) {
    memcpy(dst_ptr1, src_ptr1, linesize * sizeof(src_ptr1[0]));
    dst_ptr1 += dst_pitch;
  }

  for (i = 0; i < extend_bottom; i++) {
    memcpy(dst_ptr2, src_ptr2, linesize * sizeof(src_ptr2[0]));
    dst_ptr2 += dst_pitch;
  }
}